

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

LineInterpolationRange __thiscall
tcu::anon_unknown_3::calcLineInterpolationWeightsAxisProjected
          (anon_unknown_3 *this,Vec2 *pa,float wa,Vec2 *pb,float wb,Vec2 *pr)

{
  float fVar1;
  float fVar2;
  LineInterpolationRange *returnValue;
  float fVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Vec2 VVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Vec2 VVar12;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  uint uVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  LineInterpolationRange LVar40;
  
  fVar18 = pb->m_data[0] - pa->m_data[0];
  fVar22 = pb->m_data[1] - pa->m_data[1];
  fVar37 = -fVar18;
  if (-fVar18 <= fVar18) {
    fVar37 = fVar18;
  }
  fVar18 = -fVar22;
  if (-fVar22 <= fVar22) {
    fVar18 = fVar22;
  }
  uVar4 = (ulong)((uint)(fVar37 < fVar18) * 4);
  fVar22 = *(float *)((long)pa->m_data + uVar4);
  fVar19 = *(float *)((long)pr->m_data + uVar4) - fVar22;
  fVar23 = fVar19;
  if (ABS(fVar19) != INFINITY) {
    fVar3 = (float)((uint)fVar19 & 0x7f800000);
    fVar23 = 1.1754944e-38;
    if (((uint)fVar19 & 0x7fffff) == 0) {
      fVar23 = fVar3;
    }
    if (fVar3 != 0.0) {
      fVar23 = fVar3;
    }
    fVar23 = ((float)((int)fVar23 + 0x2000) - fVar23) + fVar19;
  }
  if (ABS(fVar19) != INFINITY) {
    fVar2 = (float)((uint)fVar19 & 0x7f800000);
    fVar3 = 1.1754944e-38;
    if (((uint)fVar19 & 0x7fffff) == 0) {
      fVar3 = fVar2;
    }
    if (fVar2 != 0.0) {
      fVar3 = fVar2;
    }
    fVar19 = fVar19 - ((float)((int)fVar3 + 0x2000) - fVar3);
  }
  fVar22 = pb->m_data[fVar37 < fVar18] - fVar22;
  fVar37 = fVar22;
  if (ABS(fVar22) != INFINITY) {
    fVar18 = (float)((uint)fVar22 & 0x7f800000);
    fVar37 = 1.1754944e-38;
    if (((uint)fVar22 & 0x7fffff) == 0) {
      fVar37 = fVar18;
    }
    if (fVar18 != 0.0) {
      fVar37 = fVar18;
    }
    fVar37 = ((float)((int)fVar37 + 0x2000) - fVar37) + fVar22;
  }
  if (ABS(fVar22) != INFINITY) {
    fVar3 = (float)((uint)fVar22 & 0x7f800000);
    fVar18 = 1.1754944e-38;
    if (((uint)fVar22 & 0x7fffff) == 0) {
      fVar18 = fVar3;
    }
    if (fVar3 != 0.0) {
      fVar18 = fVar3;
    }
    fVar22 = fVar22 - ((float)((int)fVar18 + 0x2000) - fVar18);
  }
  auVar28._0_12_ = ZEXT812(0);
  auVar28._12_4_ = 0;
  if (fVar23 != 0.0 || fVar19 != 0.0) {
    if ((fVar37 < 0.0) || (0.0 < fVar22)) {
      uVar6 = -(uint)(fVar19 / fVar37 <= fVar19 / fVar22);
      fVar18 = (float)(~uVar6 & (uint)(fVar19 / fVar37) | (uint)(fVar19 / fVar22) & uVar6);
      uVar6 = -(uint)(fVar23 / fVar37 <= fVar23 / fVar22);
      fVar3 = (float)(~uVar6 & (uint)(fVar23 / fVar37) | (uint)(fVar23 / fVar22) & uVar6);
      uVar6 = -(uint)(fVar3 <= fVar18);
      auVar28 = ZEXT416(~uVar6 & (uint)fVar3 | uVar6 & (uint)fVar18);
    }
    else {
      auVar28._0_12_ = ZEXT812(0x7f800000);
      auVar28._12_4_ = 0;
    }
  }
  fVar18 = auVar28._0_4_;
  if (ABS(fVar18) != INFINITY) {
    fVar3 = 1.1754944e-38;
    if ((auVar28 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar3 = (float)((uint)fVar18 & 0x7f800000);
    }
    if ((auVar28 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar3 = (float)((uint)fVar18 & 0x7f800000);
    }
    auVar28._0_4_ = fVar18 + ((float)((int)fVar3 + 0x6000) - fVar3);
  }
  auVar29 = ZEXT816(0);
  if (fVar23 != 0.0 || fVar19 != 0.0) {
    if ((fVar37 < 0.0) || (0.0 < fVar22)) {
      uVar6 = -(uint)(fVar19 / fVar22 <= fVar19 / fVar37);
      fVar18 = (float)(~uVar6 & (uint)(fVar19 / fVar37) | (uint)(fVar19 / fVar22) & uVar6);
      uVar6 = -(uint)(fVar23 / fVar22 <= fVar23 / fVar37);
      fVar37 = (float)(~uVar6 & (uint)(fVar23 / fVar37) | (uint)(fVar23 / fVar22) & uVar6);
      uVar6 = -(uint)(fVar18 <= fVar37);
      auVar29 = ZEXT416(~uVar6 & (uint)fVar37 | uVar6 & (uint)fVar18);
    }
    else {
      auVar29._0_12_ = ZEXT812(0xff800000);
      auVar29._12_4_ = 0;
    }
  }
  fVar37 = auVar29._0_4_;
  if (ABS(fVar37) != INFINITY) {
    fVar18 = 1.1754944e-38;
    if ((auVar29 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar18 = (float)((uint)fVar37 & 0x7f800000);
    }
    if ((auVar29 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar18 = (float)((uint)fVar37 & 0x7f800000);
    }
    auVar29._0_4_ = fVar37 - ((float)((int)fVar18 + 0x6000) - fVar18);
  }
  auVar20._0_12_ = ZEXT812(0);
  auVar20._12_4_ = 0;
  fVar18 = auVar29._0_4_;
  uVar6 = auVar29._8_4_;
  uVar27 = auVar29._12_4_;
  fVar37 = auVar28._0_4_;
  if (fVar37 != 0.0 || fVar18 != 0.0) {
    if ((wb != 0.0) || (NAN(wb))) {
      uVar5 = -(uint)(fVar37 / wb <= fVar18 / wb);
      auVar24._0_4_ = (uint)(fVar18 / wb) & uVar5;
      auVar24._4_4_ = 0;
      auVar24._8_4_ = uVar6 & auVar28._8_4_;
      auVar24._12_4_ = uVar27 & auVar28._12_4_;
      auVar20 = ZEXT416(~uVar5 & (uint)(fVar37 / wb)) | auVar24;
    }
    else {
      auVar20._0_12_ = ZEXT812(0x7f800000);
      auVar20._12_4_ = 0;
    }
  }
  fVar22 = auVar20._0_4_;
  if (ABS(fVar22) != INFINITY) {
    fVar23 = 1.1754944e-38;
    if ((auVar20 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar23 = (float)((uint)fVar22 & 0x7f800000);
    }
    if ((auVar20 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar23 = (float)((uint)fVar22 & 0x7f800000);
    }
    auVar20._0_4_ = fVar22 + ((float)((int)fVar23 + 0x6000) - fVar23);
  }
  auVar26 = ZEXT816(0);
  if (fVar37 != 0.0 || fVar18 != 0.0) {
    if ((wb != 0.0) || (NAN(wb))) {
      uVar5 = -(uint)(fVar18 / wb <= fVar37 / wb);
      auVar32._0_4_ = (uint)(fVar18 / wb) & uVar5;
      auVar32._4_4_ = 0;
      auVar32._8_4_ = uVar6;
      auVar32._12_4_ = uVar27;
      auVar25._0_4_ = ~uVar5 & (uint)(fVar37 / wb);
      auVar25._4_4_ = 0;
      auVar25._8_4_ = ~uVar6 & auVar28._8_4_;
      auVar25._12_4_ = ~uVar27 & auVar28._12_4_;
      auVar26 = auVar25 | auVar32;
    }
    else {
      auVar26._0_12_ = ZEXT812(0xff800000);
      auVar26._12_4_ = 0;
    }
  }
  fVar22 = auVar26._0_4_;
  if (ABS(fVar22) != INFINITY) {
    fVar23 = 1.1754944e-38;
    if ((auVar26 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar23 = (float)((uint)fVar22 & 0x7f800000);
    }
    if ((auVar26 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar23 = (float)((uint)fVar22 & 0x7f800000);
    }
    auVar26._0_4_ = fVar22 - ((float)((int)fVar23 + 0x6000) - fVar23);
  }
  fVar37 = 1.0 - fVar37;
  fVar18 = 1.0 - fVar18;
  auVar13._0_12_ = ZEXT812(0);
  auVar13._12_4_ = 0;
  if (fVar37 != 0.0 || fVar18 != 0.0) {
    if ((wa != 0.0) || (NAN(wa))) {
      uVar6 = -(uint)(fVar18 / wa <= fVar37 / wa);
      auVar13 = ZEXT416(~uVar6 & (uint)(fVar18 / wa) | (uint)(fVar37 / wa) & uVar6);
    }
    else {
      auVar13._0_12_ = ZEXT812(0x7f800000);
      auVar13._12_4_ = 0;
    }
  }
  fVar22 = auVar13._0_4_;
  if (ABS(fVar22) != INFINITY) {
    fVar23 = 1.1754944e-38;
    if ((auVar13 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar23 = (float)((uint)fVar22 & 0x7f800000);
    }
    if ((auVar13 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar23 = (float)((uint)fVar22 & 0x7f800000);
    }
    auVar13._0_4_ = fVar22 + ((float)((int)fVar23 + 0x6000) - fVar23);
  }
  auVar30 = ZEXT816(0);
  if (fVar37 != 0.0 || fVar18 != 0.0) {
    if ((wa != 0.0) || (NAN(wa))) {
      uVar6 = -(uint)(fVar37 / wa <= fVar18 / wa);
      auVar30 = ZEXT416(~uVar6 & (uint)(fVar18 / wa) | (uint)(fVar37 / wa) & uVar6);
    }
    else {
      auVar30._0_12_ = ZEXT812(0xff800000);
      auVar30._12_4_ = 0;
    }
  }
  fVar37 = auVar30._0_4_;
  if (ABS(fVar37) != INFINITY) {
    fVar18 = 1.1754944e-38;
    if ((auVar30 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar18 = (float)((uint)fVar37 & 0x7f800000);
    }
    if ((auVar30 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar18 = (float)((uint)fVar37 & 0x7f800000);
    }
    auVar30._0_4_ = fVar37 - ((float)((int)fVar18 + 0x6000) - fVar18);
  }
  fVar22 = auVar20._0_4_;
  auVar10._4_12_ = auVar20._4_12_;
  fVar18 = auVar13._0_4_;
  fVar37 = fVar22 + fVar18;
  if (ABS(fVar37) != INFINITY) {
    fVar19 = (float)((uint)fVar37 & 0x7f800000);
    fVar23 = 1.1754944e-38;
    if (((uint)fVar37 & 0x7fffff) == 0) {
      fVar23 = fVar19;
    }
    if (fVar19 != 0.0) {
      fVar23 = fVar19;
    }
    fVar37 = fVar37 + ((float)((int)fVar23 + 0x2000) - fVar23);
  }
  auVar10._0_4_ = fVar37;
  VVar9.m_data = auVar10._0_8_;
  fVar23 = auVar26._0_4_;
  uVar6 = auVar26._4_4_;
  uVar27 = auVar26._8_4_;
  uVar5 = auVar26._12_4_;
  fVar3 = auVar30._0_4_;
  fVar19 = fVar23 + fVar3;
  if (ABS(fVar19) != INFINITY) {
    fVar1 = (float)((uint)fVar19 & 0x7f800000);
    fVar2 = 1.1754944e-38;
    if (((uint)fVar19 & 0x7fffff) == 0) {
      fVar2 = fVar1;
    }
    if (fVar1 != 0.0) {
      fVar2 = fVar1;
    }
    fVar19 = fVar19 - ((float)((int)fVar2 + 0x2000) - fVar2);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  auVar33._0_12_ = ZEXT812(0);
  auVar33._12_4_ = 0;
  uVar8 = auVar30._8_4_;
  uVar31 = auVar30._12_4_;
  if (fVar18 != 0.0 || fVar3 != 0.0) {
    if ((fVar37 < 0.0) || (0.0 < fVar19)) {
      uVar7 = -(uint)(fVar3 / fVar37 <= fVar3 / fVar19);
      fVar2 = (float)(~uVar7 & (uint)(fVar3 / fVar37) | (uint)(fVar3 / fVar19) & uVar7);
      uVar7 = -(uint)(fVar18 / fVar37 <= fVar18 / fVar19);
      fVar1 = (float)(~uVar7 & (uint)(fVar18 / fVar37) | (uint)(fVar18 / fVar19) & uVar7);
      uVar7 = -(uint)(fVar1 <= fVar2);
      auVar38._0_4_ = uVar7 & (uint)fVar2;
      auVar38._4_4_ = 0;
      auVar38._8_4_ = auVar13._8_4_ & uVar8;
      auVar38._12_4_ = auVar13._12_4_ & uVar31;
      auVar33 = ZEXT416(~uVar7 & (uint)fVar1) | auVar38;
    }
    else {
      auVar33._0_12_ = ZEXT812(0x7f800000);
      auVar33._12_4_ = 0;
    }
  }
  fVar2 = auVar33._0_4_;
  if (ABS(fVar2) != INFINITY) {
    fVar1 = 1.1754944e-38;
    if ((auVar33 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar1 = (float)((uint)fVar2 & 0x7f800000);
    }
    if ((auVar33 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar1 = (float)((uint)fVar2 & 0x7f800000);
    }
    auVar33._0_4_ = fVar2 + ((float)((int)fVar1 + 0x6000) - fVar1);
  }
  *(int *)this = auVar33._0_4_;
  auVar34._0_12_ = ZEXT812(0);
  auVar34._12_4_ = 0;
  if (fVar22 != 0.0 || fVar23 != 0.0) {
    if ((fVar37 < 0.0) || (0.0 < fVar19)) {
      uVar7 = -(uint)(fVar23 / fVar37 <= fVar23 / fVar19);
      fVar2 = (float)(~uVar7 & (uint)(fVar23 / fVar37) | (uint)(fVar23 / fVar19) & uVar7);
      uVar7 = -(uint)(fVar22 / fVar37 <= fVar22 / fVar19);
      fVar1 = (float)(~uVar7 & (uint)(fVar22 / fVar37) | (uint)(fVar22 / fVar19) & uVar7);
      uVar7 = -(uint)(fVar1 <= fVar2);
      auVar39._0_4_ = uVar7 & (uint)fVar2;
      auVar39._4_4_ = auVar20._4_4_ & uVar6;
      auVar39._8_4_ = auVar20._8_4_ & uVar27;
      auVar39._12_4_ = auVar20._12_4_ & uVar5;
      auVar34 = ZEXT416(~uVar7 & (uint)fVar1) | auVar39;
    }
    else {
      auVar34._0_12_ = ZEXT812(0x7f800000);
      auVar34._12_4_ = 0;
    }
  }
  fVar2 = auVar34._0_4_;
  if (ABS(fVar2) != INFINITY) {
    fVar1 = 1.1754944e-38;
    if ((auVar34 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar1 = (float)((uint)fVar2 & 0x7f800000);
    }
    if ((auVar34 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar1 = (float)((uint)fVar2 & 0x7f800000);
    }
    auVar34._0_4_ = fVar2 + ((float)((int)fVar1 + 0x6000) - fVar1);
  }
  *(int *)(this + 4) = auVar34._0_4_;
  auVar36 = ZEXT816(0);
  if (fVar18 != 0.0 || fVar3 != 0.0) {
    if ((fVar37 < 0.0) || (0.0 < fVar19)) {
      uVar7 = -(uint)(fVar3 / fVar19 <= fVar3 / fVar37);
      fVar3 = (float)(~uVar7 & (uint)(fVar3 / fVar37) | (uint)(fVar3 / fVar19) & uVar7);
      uVar7 = -(uint)(fVar18 / fVar19 <= fVar18 / fVar37);
      fVar18 = (float)(~uVar7 & (uint)(fVar18 / fVar37) | (uint)(fVar18 / fVar19) & uVar7);
      uVar7 = -(uint)(fVar3 <= fVar18);
      auVar14._0_4_ = uVar7 & (uint)fVar3;
      auVar14._4_4_ = 0;
      auVar14._8_4_ = uVar8;
      auVar14._12_4_ = uVar31;
      auVar35._0_4_ = ~uVar7 & (uint)fVar18;
      auVar35._4_4_ = 0;
      auVar35._8_4_ = ~uVar8 & auVar13._8_4_;
      auVar35._12_4_ = ~uVar31 & auVar13._12_4_;
      auVar36 = auVar35 | auVar14;
    }
    else {
      auVar36._0_12_ = ZEXT812(0xff800000);
      auVar36._12_4_ = 0;
    }
  }
  fVar18 = auVar36._0_4_;
  if (ABS(fVar18) != INFINITY) {
    fVar3 = 1.1754944e-38;
    if ((auVar36 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar3 = (float)((uint)fVar18 & 0x7f800000);
    }
    if ((auVar36 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar3 = (float)((uint)fVar18 & 0x7f800000);
    }
    auVar36._0_4_ = fVar18 - ((float)((int)fVar3 + 0x6000) - fVar3);
  }
  *(int *)(this + 8) = auVar36._0_4_;
  auVar16 = ZEXT816(0);
  if (fVar22 != 0.0 || fVar23 != 0.0) {
    if ((fVar37 < 0.0) || (0.0 < fVar19)) {
      uVar8 = -(uint)(fVar23 / fVar19 <= fVar23 / fVar37);
      fVar18 = (float)(~uVar8 & (uint)(fVar23 / fVar37) | (uint)(fVar23 / fVar19) & uVar8);
      uVar8 = -(uint)(fVar22 / fVar19 <= fVar22 / fVar37);
      auVar11._0_4_ = (uint)(fVar22 / fVar19) & uVar8;
      auVar11._4_4_ = auVar20._4_4_;
      auVar11._8_4_ = auVar20._8_4_;
      auVar11._12_4_ = auVar20._12_4_;
      auVar11 = ZEXT416(~uVar8 & (uint)(fVar22 / fVar37)) | auVar11;
      VVar9.m_data = auVar11._0_8_;
      uVar8 = -(uint)(fVar18 <= auVar11._0_4_);
      auVar21._0_4_ = uVar8 & (uint)fVar18;
      auVar21._4_4_ = uVar6;
      auVar21._8_4_ = uVar27;
      auVar21._12_4_ = uVar5;
      auVar15._0_4_ = ~uVar8 & (uint)auVar11._0_4_;
      auVar15._4_4_ = ~uVar6 & auVar11._4_4_;
      auVar15._8_4_ = ~uVar27 & auVar11._8_4_;
      auVar15._12_4_ = ~uVar5 & auVar11._12_4_;
      auVar16 = auVar15 | auVar21;
    }
    else {
      auVar16._0_12_ = ZEXT812(0xff800000);
      auVar16._12_4_ = 0;
    }
  }
  VVar12.m_data = auVar16._0_8_;
  fVar37 = auVar16._0_4_;
  if (ABS(fVar37) != INFINITY) {
    fVar18 = 1.1754944e-38;
    if ((auVar16 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0) {
      fVar18 = (float)((uint)fVar37 & 0x7f800000);
    }
    if ((auVar16 & (undefined1  [16])0x7f800000) != (undefined1  [16])0x0) {
      fVar18 = (float)((uint)fVar37 & 0x7f800000);
    }
    VVar9.m_data[0] = (float)((int)fVar18 + 0x6000) - fVar18;
    VVar9.m_data[1] = 0.0;
    auVar17._4_12_ = auVar16._4_12_;
    auVar17._0_4_ = fVar37 - VVar9.m_data[0];
    VVar12.m_data = auVar17._0_8_;
  }
  *(float *)(this + 0xc) = VVar12.m_data[0];
  LVar40.min.m_data[0] = VVar12.m_data[0];
  LVar40.min.m_data[1] = VVar12.m_data[1];
  LVar40.max.m_data[0] = VVar9.m_data[0];
  LVar40.max.m_data[1] = VVar9.m_data[1];
  return LVar40;
}

Assistant:

LineInterpolationRange calcLineInterpolationWeightsAxisProjected (const tcu::Vec2& pa, float wa, const tcu::Vec2& pb, float wb, const tcu::Vec2& pr)
{
	const int	roundError		= 1;
	const int	divError		= 3;
	const bool	isXMajor		= isLineXMajor(pa, pb);
	const int	majorAxisNdx	= (isXMajor) ? (0) : (1);

	// calc weights:
	//			(1-t) / wa					t / wb
	//		-------------------	,	-------------------
	//		(1-t) / wa + t / wb		(1-t) / wa + t / wb

	// Use axis projected (inaccurate) method, i.e. for X-major lines:
	//     (xd - xa) * (xb - xa)      xd - xa
	// t = ---------------------  ==  -------
	//       ( xb - xa ) ^ 2          xb - xa

	// Allow 1 ULP
	const float		dividend	= (pr[majorAxisNdx] - pa[majorAxisNdx]);
	const float		dividendMax	= getMaxValueWithinError(dividend, 1);
	const float		dividendMin	= getMinValueWithinError(dividend, 1);
	DE_ASSERT(dividendMin <= dividendMax);

	// Allow 1 ULP
	const float		divisor		= (pb[majorAxisNdx] - pa[majorAxisNdx]);
	const float		divisorMax	= getMaxValueWithinError(divisor, 1);
	const float		divisorMin	= getMinValueWithinError(divisor, 1);
	DE_ASSERT(divisorMin <= divisorMax);

	// Allow 3 ULP precision for division
	const float		tMax		= getMaxValueWithinError(maximalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	const float		tMin		= getMinValueWithinError(minimalRangeDivision(dividendMin, dividendMax, divisorMin, divisorMax), divError);
	DE_ASSERT(tMin <= tMax);

	const float		perspectiveTMax			= getMaxValueWithinError(maximalRangeDivision(tMin, tMax, wb, wb), divError);
	const float		perspectiveTMin			= getMinValueWithinError(minimalRangeDivision(tMin, tMax, wb, wb), divError);
	DE_ASSERT(perspectiveTMin <= perspectiveTMax);

	const float		perspectiveInvTMax		= getMaxValueWithinError(maximalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	const float		perspectiveInvTMin		= getMinValueWithinError(minimalRangeDivision((1.0f - tMax), (1.0f - tMin), wa, wa), divError);
	DE_ASSERT(perspectiveInvTMin <= perspectiveInvTMax);

	const float		perspectiveDivisorMax	= getMaxValueWithinError(perspectiveTMax + perspectiveInvTMax, roundError);
	const float		perspectiveDivisorMin	= getMinValueWithinError(perspectiveTMin + perspectiveInvTMin, roundError);
	DE_ASSERT(perspectiveDivisorMin <= perspectiveDivisorMax);

	LineInterpolationRange returnValue;
	returnValue.max.x() = getMaxValueWithinError(maximalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.max.y() = getMaxValueWithinError(maximalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.x() = getMinValueWithinError(minimalRangeDivision(perspectiveInvTMin,	perspectiveInvTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);
	returnValue.min.y() = getMinValueWithinError(minimalRangeDivision(perspectiveTMin,		perspectiveTMax,	perspectiveDivisorMin, perspectiveDivisorMax), divError);

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());

	return returnValue;
}